

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O1

int gpioSerialReadInvert(uint gpio,uint invert)

{
  ulong uVar1;
  FILE *pFVar2;
  int iVar3;
  
  pFVar2 = _stderr;
  uVar1 = (ulong)gpio;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    fprintf(pFVar2,"%s %s: gpio=%d invert=%d\n",myTimeStamp::buf,"gpioSerialReadInvert",uVar1,invert
           );
  }
  pFVar2 = _stderr;
  if (libInitialised == '\0') {
    iVar3 = -0x1f;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      gpioSerialReadInvert_cold_1();
    }
  }
  else if (gpio < 0x20) {
    if (wfRx[uVar1].mode == 1) {
      if (invert < 2) {
        wfRx[uVar1].field_4.s.invert = invert;
        iVar3 = 0;
      }
      else {
        iVar3 = -0x79;
        if ((gpioCfg.internals >> 10 & 1) == 0) {
          myTimeStamp();
          fprintf(pFVar2,"%s %s: bad invert level for gpio %d (%d)\n",myTimeStamp::buf,
                  "gpioSerialReadInvert",uVar1,invert);
        }
      }
    }
    else {
      iVar3 = -0x26;
      if ((gpioCfg.internals >> 10 & 1) == 0) {
        gpioSerialReadInvert_cold_2();
      }
    }
  }
  else {
    iVar3 = -2;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      gpioSerialReadInvert_cold_3();
    }
  }
  return iVar3;
}

Assistant:

int gpioSerialReadInvert(unsigned gpio, unsigned invert)
{
   DBG(DBG_USER, "gpio=%d invert=%d", gpio, invert);

   CHECK_INITED;

   if (gpio > PI_MAX_USER_GPIO)
      SOFT_ERROR(PI_BAD_USER_GPIO, "bad gpio (%d)", gpio);

   if (wfRx[gpio].mode != PI_WFRX_SERIAL)
      SOFT_ERROR(PI_NOT_SERIAL_GPIO, "no serial read on gpio (%d)", gpio);

   if ((invert < PI_BB_SER_NORMAL) ||
       (invert > PI_BB_SER_INVERT))
      SOFT_ERROR(PI_BAD_SER_INVERT,
         "bad invert level for gpio %d (%d)", gpio, invert);

   wfRx[gpio].s.invert = invert;

   return 0;
}